

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestCaseUtil.hpp
# Opt level: O1

TestInstance * __thiscall
vkt::
InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
::createInstance(InstanceFactory1<vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>,_vkt::FunctionInstance1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>::Args,_vkt::FunctionPrograms1<vkt::api::(anonymous_namespace)::ShaderModule::Parameters>_>
                 *this,Context *context)

{
  pointer pcVar1;
  TestInstance *pTVar2;
  
  pTVar2 = (TestInstance *)operator_new(0x40);
  pTVar2->m_context = context;
  pTVar2->_vptr_TestInstance = (_func_int **)&PTR__FunctionInstance1_00d1c7d8;
  pTVar2[1]._vptr_TestInstance = (_func_int **)(this->m_arg0).func;
  *(VkShaderStageFlagBits *)&pTVar2[1].m_context = (this->m_arg0).arg0.shaderStage;
  pTVar2[2]._vptr_TestInstance = (_func_int **)(pTVar2 + 3);
  pcVar1 = (this->m_arg0).arg0.binaryName._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(pTVar2 + 2),pcVar1,pcVar1 + (this->m_arg0).arg0.binaryName._M_string_length)
  ;
  return pTVar2;
}

Assistant:

TestInstance*	createInstance		(Context& context) const { return new Instance(context, m_arg0); }